

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::ensureLayouted(QTextDocumentLayoutPrivate *this,QFixed y)

{
  int iVar1;
  int iVar2;
  
  if (this->currentLazyLayoutPosition != -1) {
    QTextDocumentLayout::dynamicDocumentSize
              (*(QTextDocumentLayout **)&(this->super_QAbstractTextDocumentLayoutPrivate).field_0x8)
    ;
    if ((this->checkPoints).d.size == 0) {
      ensureLayoutedByPosition(this,this->lazyLayoutStepSize + this->currentLazyLayoutPosition);
      iVar1 = this->lazyLayoutStepSize * 2;
      if (199999 < iVar1) {
        iVar1 = 200000;
      }
      this->lazyLayoutStepSize = iVar1;
    }
    iVar1 = this->currentLazyLayoutPosition;
    while ((iVar1 != -1 &&
           ((this->checkPoints).d.ptr[(this->checkPoints).d.size + -1].y.val < y.val))) {
      ensureLayoutedByPosition(this,iVar1 + this->lazyLayoutStepSize);
      iVar1 = this->currentLazyLayoutPosition;
      iVar2 = this->lazyLayoutStepSize * 2;
      if (199999 < iVar2) {
        iVar2 = 200000;
      }
      this->lazyLayoutStepSize = iVar2;
    }
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::ensureLayouted(QFixed y) const
{
    Q_Q(const QTextDocumentLayout);
    if (currentLazyLayoutPosition == -1)
        return;
    const QSizeF oldSize = q->dynamicDocumentSize();
    Q_UNUSED(oldSize);

    if (checkPoints.isEmpty())
        layoutStep();

    while (currentLazyLayoutPosition != -1
           && checkPoints.last().y < y)
        layoutStep();
}